

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_wav_seek_to_first_pcm_frame(ma_dr_wav *pWav)

{
  ma_bool32 mVar1;
  ma_bool32 mVar2;
  
  mVar2 = 0;
  if (pWav->onWrite == (ma_dr_wav_write_proc)0x0) {
    mVar2 = 0;
    mVar1 = (*pWav->onSeek)(pWav->pUserData,(int)pWav->dataChunkDataPos,ma_dr_wav_seek_origin_start)
    ;
    if (mVar1 != 0) {
      if (pWav->translatedFormatTag == 0x11) {
        (pWav->ima).cachedFrames[0xb] = 0;
        (pWav->ima).cachedFrames[0xc] = 0;
        (pWav->ima).cachedFrames[0xd] = 0;
        (pWav->ima).cachedFrames[0xe] = 0;
        (pWav->ima).cachedFrames[7] = 0;
        (pWav->ima).cachedFrames[8] = 0;
        (pWav->ima).cachedFrames[9] = 0;
        (pWav->ima).cachedFrames[10] = 0;
        (pWav->ima).cachedFrames[3] = 0;
        (pWav->ima).cachedFrames[4] = 0;
        (pWav->ima).cachedFrames[5] = 0;
        (pWav->ima).cachedFrames[6] = 0;
        *(undefined8 *)((pWav->ima).stepIndex + 1) = 0;
        (pWav->ima).cachedFrames[1] = 0;
        (pWav->ima).cachedFrames[2] = 0;
        (pWav->ima).bytesRemainingInBlock = 0;
        (pWav->ima).predictor[0] = 0;
        *(undefined8 *)((pWav->ima).predictor + 1) = 0;
        *(undefined8 *)((pWav->ima).cachedFrames + 0xf) = 0;
      }
      else if (pWav->translatedFormatTag == 2) {
        (pWav->msadpcm).cachedFrameCount = 0;
        *(ma_int32 *)((long)((pWav->msadpcm).prevFrames + 0) + 0) = 0;
        *(undefined8 *)((pWav->msadpcm).prevFrames[0] + 1) = 0;
        (pWav->msadpcm).cachedFrames[0] = 0;
        (pWav->msadpcm).cachedFrames[1] = 0;
        (pWav->msadpcm).cachedFrames[2] = 0;
        (pWav->msadpcm).cachedFrames[3] = 0;
        (pWav->msadpcm).bytesRemainingInBlock = 0;
        (pWav->msadpcm).predictor[0] = 0;
        (pWav->msadpcm).predictor[1] = 0;
        (pWav->msadpcm).delta[0] = 0;
        (pWav->msadpcm).delta[1] = 0;
        (pWav->msadpcm).prevFrames[1][1] = 0;
      }
      pWav->readCursorInPCMFrames = 0;
      pWav->bytesRemaining = pWav->dataChunkDataSize;
      mVar2 = 1;
    }
  }
  return mVar2;
}

Assistant:

MA_PRIVATE ma_bool32 ma_dr_wav_seek_to_first_pcm_frame(ma_dr_wav* pWav)
{
    if (pWav->onWrite != NULL) {
        return MA_FALSE;
    }
    if (!pWav->onSeek(pWav->pUserData, (int)pWav->dataChunkDataPos, ma_dr_wav_seek_origin_start)) {
        return MA_FALSE;
    }
    if (ma_dr_wav__is_compressed_format_tag(pWav->translatedFormatTag)) {
        if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ADPCM) {
            MA_DR_WAV_ZERO_OBJECT(&pWav->msadpcm);
        } else if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_DVI_ADPCM) {
            MA_DR_WAV_ZERO_OBJECT(&pWav->ima);
        } else {
            MA_DR_WAV_ASSERT(MA_FALSE);
        }
    }
    pWav->readCursorInPCMFrames = 0;
    pWav->bytesRemaining = pWav->dataChunkDataSize;
    return MA_TRUE;
}